

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O0

OCSPRevocationStatus
bssl::anon_unknown_18::CheckOCSP
          (string_view raw_response,string_view certificate_der,ParsedCertificate *certificate,
          string_view issuer_certificate_der,ParsedCertificate *issuer_certificate,
          int64_t verify_time_epoch_seconds,optional<long> max_age_seconds,
          ResponseStatus *response_details)

{
  optional<long> max_age_seconds_00;
  string_view der;
  bool bVar1;
  OCSPResponseData *out;
  ParsedTbsCertificate *pPVar2;
  char *extraout_RDX;
  string_view s;
  Input raw_tlv;
  Input response_extensions;
  Span<const_unsigned_char> data;
  undefined8 in_stack_fffffffffffffdb0;
  OCSPRevocationStatus status;
  shared_ptr<const_bssl::ParsedCertificate> local_1b8;
  size_t local_1a8;
  size_t sStack_1a0;
  shared_ptr<const_bssl::ParsedCertificate> local_198;
  undefined1 local_188 [8];
  shared_ptr<const_bssl::ParsedCertificate> parsed_issuer_certificate;
  shared_ptr<const_bssl::ParsedCertificate> parsed_certificate;
  undefined1 local_140 [8];
  OCSPResponseData response_data;
  Span<const_unsigned_char> local_a8;
  undefined1 local_98 [8];
  OCSPResponse response;
  ParsedCertificate *issuer_certificate_local;
  ParsedCertificate *certificate_local;
  string_view certificate_der_local;
  string_view raw_response_local;
  
  certificate_der_local._M_len = (size_t)certificate_der._M_str;
  s._M_len = raw_response._M_str;
  certificate_der_local._M_str = (char *)raw_response._M_len;
  *response_details = NOT_CHECKED;
  response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)issuer_certificate;
  bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &certificate_der_local._M_str);
  if (bVar1) {
    *response_details = MISSING;
    return MAX_VALUE;
  }
  OCSPResponse::OCSPResponse((OCSPResponse *)local_98);
  s._M_str = extraout_RDX;
  data = StringAsBytes((bssl *)certificate_der_local._M_str,s);
  out = (OCSPResponseData *)data.data_;
  bssl::der::Input::Input((Input *)&local_a8,data);
  bVar1 = ParseOCSPResponse((Input)local_a8,(OCSPResponse *)local_98);
  if (!bVar1) {
    *response_details = PARSE_RESPONSE_ERROR;
    raw_response_local._M_str._4_4_ = MAX_VALUE;
    response_data.extensions.data_.size_._0_4_ = 1;
    goto LAB_005e67d4;
  }
  if (local_98._0_4_ != SUCCESSFUL) {
    *response_details = ERROR_RESPONSE;
    raw_response_local._M_str._4_4_ = MAX_VALUE;
    response_data.extensions.data_.size_._0_4_ = 1;
    goto LAB_005e67d4;
  }
  OCSPResponseData::OCSPResponseData((OCSPResponseData *)local_140);
  raw_tlv.data_.size_ = (size_t)local_140;
  raw_tlv.data_.data_ = response.data.data_.data_;
  bVar1 = ParseOCSPResponseData((bssl *)response._0_8_,raw_tlv,out);
  if (bVar1) {
    if ((((byte)response_data.responses.
                super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 1) == 0) ||
       (response_extensions.data_.size_ = (size_t)response_details,
       response_extensions.data_.data_ = response_data.extensions.data_.data_,
       bVar1 = ParseOCSPResponseDataExtensions
                         ((anon_unknown_18 *)response_data._80_8_,response_extensions,
                          (ResponseStatus *)out), bVar1)) {
      ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                ((shared_ptr<const_bssl::ParsedCertificate> *)
                 &parsed_issuer_certificate.
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                ((shared_ptr<const_bssl::ParsedCertificate> *)local_188);
      issuer_certificate_local = certificate;
      if (certificate == (ParsedCertificate *)0x0) {
        sStack_1a0 = certificate_der_local._M_len;
        der._M_str = (char *)certificate_der_local._M_len;
        der._M_len = certificate_der._M_len;
        local_1a8 = certificate_der._M_len;
        OCSPParseCertificate((anon_unknown_18 *)&local_198,der);
        ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=
                  ((shared_ptr<const_bssl::ParsedCertificate> *)
                   &parsed_issuer_certificate.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&local_198);
        ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&local_198);
        issuer_certificate_local =
             ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
                        &parsed_issuer_certificate.
                         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
      }
      if (response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        OCSPParseCertificate((anon_unknown_18 *)&local_1b8,issuer_certificate_der);
        ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=
                  ((shared_ptr<const_bssl::ParsedCertificate> *)local_188,&local_1b8);
        ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&local_1b8);
        response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                      ::get((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                             *)local_188);
      }
      if ((issuer_certificate_local == (ParsedCertificate *)0x0) ||
         (response.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0)) {
        *response_details = NOT_CHECKED;
        raw_response_local._M_str._4_4_ = MAX_VALUE;
      }
      else {
        pPVar2 = ParsedCertificate::tbs(issuer_certificate_local);
        bVar1 = bssl::der::operator<
                          ((GeneralizedTime *)&response_data.responder_id.key_hash.data_.size_,
                           &pPVar2->validity_not_before);
        if (!bVar1) {
          pPVar2 = ParsedCertificate::tbs(issuer_certificate_local);
          bVar1 = bssl::der::operator>
                            ((GeneralizedTime *)&response_data.responder_id.key_hash.data_.size_,
                             &pPVar2->validity_not_after);
          if (!bVar1) {
            max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_ = in_stack_fffffffffffffdb0;
            max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload = (_Storage<long,_true>)response_details;
            raw_response_local._M_str._4_4_ =
                 GetRevocationStatusForCert
                           ((anon_unknown_18 *)local_140,
                            (OCSPResponseData *)issuer_certificate_local,
                            (ParsedCertificate *)
                            response.certs.
                            super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (ParsedCertificate *)verify_time_epoch_seconds,
                            max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_payload._M_value,
                            max_age_seconds_00,
                            (ResponseStatus *)
                            (max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long>._8_8_ & 0xffffffff));
            bVar1 = VerifyOCSPResponseSignature
                              ((OCSPResponse *)local_98,(OCSPResponseData *)local_140,
                               (ParsedCertificate *)
                               response.certs.
                               super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (!bVar1) {
              raw_response_local._M_str._4_4_ = MAX_VALUE;
            }
            goto LAB_005e67a0;
          }
        }
        *response_details = BAD_PRODUCED_AT;
        raw_response_local._M_str._4_4_ = MAX_VALUE;
      }
LAB_005e67a0:
      response_data.extensions.data_.size_._0_4_ = 1;
      ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
                ((shared_ptr<const_bssl::ParsedCertificate> *)local_188);
      ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
                ((shared_ptr<const_bssl::ParsedCertificate> *)
                 &parsed_issuer_certificate.
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      raw_response_local._M_str._4_4_ = MAX_VALUE;
      response_data.extensions.data_.size_._0_4_ = 1;
    }
  }
  else {
    *response_details = PARSE_RESPONSE_DATA_ERROR;
    raw_response_local._M_str._4_4_ = MAX_VALUE;
    response_data.extensions.data_.size_._0_4_ = 1;
  }
  OCSPResponseData::~OCSPResponseData((OCSPResponseData *)local_140);
LAB_005e67d4:
  OCSPResponse::~OCSPResponse((OCSPResponse *)local_98);
  return raw_response_local._M_str._4_4_;
}

Assistant:

OCSPRevocationStatus CheckOCSP(
    std::string_view raw_response, std::string_view certificate_der,
    const ParsedCertificate *certificate,
    std::string_view issuer_certificate_der,
    const ParsedCertificate *issuer_certificate,
    int64_t verify_time_epoch_seconds, std::optional<int64_t> max_age_seconds,
    OCSPVerifyResult::ResponseStatus *response_details) {
  *response_details = OCSPVerifyResult::NOT_CHECKED;

  if (raw_response.empty()) {
    *response_details = OCSPVerifyResult::MISSING;
    return OCSPRevocationStatus::UNKNOWN;
  }

  OCSPResponse response;
  if (!ParseOCSPResponse(StringAsBytes(raw_response), &response)) {
    *response_details = OCSPVerifyResult::PARSE_RESPONSE_ERROR;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // RFC 6960 defines all responses |response_status| != SUCCESSFUL as error
  // responses. No revocation information is provided on error responses, and
  // the OCSPResponseData structure is not set.
  if (response.status != OCSPResponse::ResponseStatus::SUCCESSFUL) {
    *response_details = OCSPVerifyResult::ERROR_RESPONSE;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Actual revocation information is contained within the BasicOCSPResponse as
  // a ResponseData structure. The BasicOCSPResponse was parsed above, and
  // contains an unparsed ResponseData. From RFC 6960:
  //
  // BasicOCSPResponse       ::= SEQUENCE {
  //    tbsResponseData      ResponseData,
  //    signatureAlgorithm   AlgorithmIdentifier,
  //    signature            BIT STRING,
  //    certs            [0] EXPLICIT SEQUENCE OF Certificate OPTIONAL }
  //
  // ResponseData ::= SEQUENCE {
  //     version              [0] EXPLICIT Version DEFAULT v1,
  //     responderID              ResponderID,
  //     producedAt               GeneralizedTime,
  //     responses                SEQUENCE OF SingleResponse,
  //     responseExtensions   [1] EXPLICIT Extensions OPTIONAL }
  OCSPResponseData response_data;
  if (!ParseOCSPResponseData(response.data, &response_data)) {
    *response_details = OCSPVerifyResult::PARSE_RESPONSE_DATA_ERROR;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Process the OCSP ResponseData extensions. In particular, must reject if
  // there are any critical extensions that are not understood.
  if (response_data.has_extensions &&
      !ParseOCSPResponseDataExtensions(response_data.extensions,
                                       response_details)) {
    return OCSPRevocationStatus::UNKNOWN;
  }

  std::shared_ptr<const ParsedCertificate> parsed_certificate;
  std::shared_ptr<const ParsedCertificate> parsed_issuer_certificate;
  if (!certificate) {
    parsed_certificate = OCSPParseCertificate(certificate_der);
    certificate = parsed_certificate.get();
  }
  if (!issuer_certificate) {
    parsed_issuer_certificate = OCSPParseCertificate(issuer_certificate_der);
    issuer_certificate = parsed_issuer_certificate.get();
  }

  if (!certificate || !issuer_certificate) {
    *response_details = OCSPVerifyResult::NOT_CHECKED;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // If producedAt is outside of the certificate validity period, reject the
  // response.
  if (response_data.produced_at < certificate->tbs().validity_not_before ||
      response_data.produced_at > certificate->tbs().validity_not_after) {
    *response_details = OCSPVerifyResult::BAD_PRODUCED_AT;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Look through all of the OCSPSingleResponses for a match (based on CertID
  // and time).
  OCSPRevocationStatus status = GetRevocationStatusForCert(
      response_data, certificate, issuer_certificate, verify_time_epoch_seconds,
      max_age_seconds, response_details);

  // Check that the OCSP response has a valid signature. It must either be
  // signed directly by the issuing certificate, or a valid authorized
  // responder.
  if (!VerifyOCSPResponseSignature(response, response_data,
                                   issuer_certificate)) {
    return OCSPRevocationStatus::UNKNOWN;
  }

  return status;
}